

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O3

_Bool openjtalk_setVoiceDir(OpenJTalk *oj,char *path)

{
  _Bool _Var1;
  char *pcVar2;
  char temp [260];
  char acStack_118 [272];
  
  if (oj == (OpenJTalk *)0x0) {
    g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
  }
  else {
    oj->errorCode = OPENJTALKERROR_NO_ERROR;
    if ((path == (char *)0x0) || (*path == '\0')) {
      oj->errorCode = OPENJTALKERROR_PATH_STRING_IS_NULL_OR_EMPTY;
    }
    else {
      pcVar2 = u8tou8_path(path,acStack_118);
      if (pcVar2 != (char *)0x0) {
        _Var1 = set_voice_dir_and_voice(oj,acStack_118);
        return _Var1;
      }
    }
  }
  return false;
}

Assistant:

OPENJTALK_CONVENTION openjtalk_setVoiceDir(OpenJTalk *oj, const char *path)
{
	if (!oj)
	{
		g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
		return false;
	}

	oj->errorCode = OPENJTALKERROR_NO_ERROR;
	if (!path || strlen(path) == 0)
	{
		oj->errorCode = OPENJTALKERROR_PATH_STRING_IS_NULL_OR_EMPTY;
		return false;
	}
	char temp[MAX_PATH];
#if defined(_WIN32)
	char *res = u8tou8_path(path, temp);
#else
	char *res = u8tou8_path(path, temp);
#endif
	if (!res)
	{
		return false;
	}
	return set_voice_dir_and_voice(oj, temp);
}